

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O1

void intobucket(bucket_conflict *b,list_conflict head,list_conflict tail,int size,group_conflict g)

{
  bucket_conflict pbVar1;
  bucket_conflict pbVar2;
  
  pbVar2 = *b;
  if ((pbVar2 == (bucket_conflict)0x0) || (pbVar2->tag != g)) {
    pbVar1 = (bucket_conflict)allocmem(bucketmem,0x28);
    pbVar1->next = pbVar2;
    pbVar1->head = head;
    pbVar1->size = size;
    pbVar1->tag = g;
    *b = pbVar1;
    pbVar2 = pbVar1;
  }
  else {
    pbVar2->tail->next = head;
    pbVar2->size = pbVar2->size + size;
  }
  tail->next = (list)0x0;
  pbVar2->tail = tail;
  return;
}

Assistant:

static void intobucket(bucket *b, list head, list tail,
                       int size, group g)
{
   bucket btemp = *b, newb;

   if (!btemp || btemp->tag != g) {   /* create new tag */
      newb = (bucket) allocmem(bucketmem, sizeof(struct bucketrec));
      newb->next = btemp;
      newb->head = head;
      newb->size = size;
      newb->tag = g;
      *b = btemp = newb;
   } else {   /* append */
      btemp->tail->next = head;
      btemp->size += size;
   }
   tail->next = NULL;
   btemp->tail = tail;
}